

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void pstack::print_container<std::vector<unsigned_char,std::allocator<unsigned_char>>,char_const&>
               (ostream *os,vector<unsigned_char,_std::allocator<unsigned_char>_> *container,
               char *ctx)

{
  bool bVar1;
  ostream *os_00;
  JSON<unsigned_char,_char> local_60;
  uchar *local_50;
  uchar *field;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  char *sep;
  char *ctx_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *container_local;
  ostream *os_local;
  
  std::operator<<(os,"[ ");
  __range2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a9a45;
  __end0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(container);
  field = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      (&__end0,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&field);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end0);
    os_00 = std::operator<<(os,(char *)__range2);
    local_60 = json<unsigned_char,char>(local_50,ctx);
    operator<<(os_00,&local_60);
    __range2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)anon_var_dwarf_c456f;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end0);
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}